

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
libcellml::Model::importRequirements_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Model *this)

{
  bool bVar1;
  element_type *peVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  ImportedEntity local_150;
  undefined1 local_140 [8];
  string url_1;
  shared_ptr<libcellml::Units> *units;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  ImportedEntity local_e0;
  undefined1 local_d0 [8];
  string url;
  shared_ptr<libcellml::Component> *component;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  *__range1;
  undefined1 local_80 [8];
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  importedUnits;
  enable_shared_from_this<libcellml::Model> local_58;
  shared_ptr<const_libcellml::ComponentEntity> local_48;
  undefined1 local_38 [8];
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  importedComponents;
  Model *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *requirements;
  
  importedComponents.
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::enable_shared_from_this<libcellml::Model>::shared_from_this(&local_58);
  std::shared_ptr<libcellml::ComponentEntity_const>::shared_ptr<libcellml::Model_const,void>
            ((shared_ptr<libcellml::ComponentEntity_const> *)&local_48,
             (shared_ptr<const_libcellml::Model> *)&local_58);
  getImportedComponents
            ((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              *)local_38,(ComponentEntityConstPtr *)&local_48);
  std::shared_ptr<const_libcellml::ComponentEntity>::~shared_ptr(&local_48);
  std::shared_ptr<const_libcellml::Model>::~shared_ptr
            ((shared_ptr<const_libcellml::Model> *)&local_58);
  std::enable_shared_from_this<libcellml::Model>::shared_from_this
            ((enable_shared_from_this<libcellml::Model> *)&__range1);
  getImportedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                    *)local_80,(ModelConstPtr *)&__range1);
  std::shared_ptr<const_libcellml::Model>::~shared_ptr
            ((shared_ptr<const_libcellml::Model> *)&__range1);
  __end1 = std::
           vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
           ::begin((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                    *)local_38);
  component = (shared_ptr<libcellml::Component> *)
              std::
              vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              ::end((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                                     *)&component), bVar1) {
    url.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
         ::operator*(&__end1);
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)url.field_2._8_8_);
    ImportedEntity::importSource(&local_e0);
    peVar2 = std::
             __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e0);
    ImportSource::url_abi_cxx11_((string *)local_d0,peVar2);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_e0);
    local_f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(__return_storage_ptr__);
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(__return_storage_ptr__);
    local_e8 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_f0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_f8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0);
    __range1_1 = (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  *)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(__return_storage_ptr__);
    bVar1 = __gnu_cxx::operator==
                      (&local_e8,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range1_1);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_d0);
    }
    std::__cxx11::string::~string((string *)local_d0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                      *)local_80);
  units = (shared_ptr<libcellml::Units> *)
          std::
          vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                 *)local_80);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                             *)&units), bVar1) {
    url_1.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
         ::operator*(&__end1_1);
    std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               url_1.field_2._8_8_);
    ImportedEntity::importSource(&local_150);
    peVar2 = std::
             __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_150);
    ImportSource::url_abi_cxx11_((string *)local_140,peVar2);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_150);
    local_160._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(__return_storage_ptr__);
    local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(__return_storage_ptr__);
    local_158 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (local_160,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_168,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140);
    local_170._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(__return_storage_ptr__);
    bVar1 = __gnu_cxx::operator==(&local_158,&local_170);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_140);
    }
    std::__cxx11::string::~string((string *)local_140);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
    ::operator++(&__end1_1);
  }
  importedComponents.
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           *)local_80);
  std::
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ::~vector((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *)local_38);
  if ((importedComponents.
       super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Model::importRequirements() const
{
    std::vector<std::string> requirements;

    auto importedComponents = getImportedComponents(shared_from_this());
    auto importedUnits = getImportedUnits(shared_from_this());

    for (auto &component : importedComponents) {
        auto url = component->importSource()->url();
        if (std::find(requirements.begin(), requirements.end(), url) == requirements.end()) {
            requirements.push_back(url);
        }
    }
    for (auto &units : importedUnits) {
        auto url = units->importSource()->url();
        if (std::find(requirements.begin(), requirements.end(), url) == requirements.end()) {
            requirements.push_back(url);
        }
    }

    return requirements;
}